

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int sasl_outcome_get_code(SASL_OUTCOME_HANDLE sasl_outcome,sasl_code *code_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  SASL_OUTCOME_INSTANCE *sasl_outcome_instance;
  uint32_t item_count;
  int result;
  sasl_code *code_value_local;
  SASL_OUTCOME_HANDLE sasl_outcome_local;
  
  if (sasl_outcome == (SASL_OUTCOME_HANDLE)0x0) {
    sasl_outcome_instance._4_4_ = 0x2deb;
  }
  else {
    _item_count = code_value;
    code_value_local = (sasl_code *)sasl_outcome;
    iVar1 = amqpvalue_get_composite_item_count
                      (sasl_outcome->composite_value,(uint32_t *)&sasl_outcome_instance);
    if (iVar1 == 0) {
      if ((int)sasl_outcome_instance == 0) {
        sasl_outcome_instance._4_4_ = 0x2df9;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(sasl_outcome->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          sasl_outcome_instance._4_4_ = 0x2e01;
        }
        else {
          iVar1 = amqpvalue_get_ubyte(value,_item_count);
          if (iVar1 == 0) {
            sasl_outcome_instance._4_4_ = 0;
          }
          else {
            sasl_outcome_instance._4_4_ = 0x2e08;
          }
        }
      }
    }
    else {
      sasl_outcome_instance._4_4_ = 0x2df3;
    }
  }
  return sasl_outcome_instance._4_4_;
}

Assistant:

int sasl_outcome_get_code(SASL_OUTCOME_HANDLE sasl_outcome, sasl_code* code_value)
{
    int result;

    if (sasl_outcome == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)sasl_outcome;
        if (amqpvalue_get_composite_item_count(sasl_outcome_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(sasl_outcome_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_sasl_code(item_value, code_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}